

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

SharedPtr<deqp::egl::GLES2ThreadTest::Texture> __thiscall
deqp::egl::GLES2ThreadTest::GLES2ResourceManager::popTexture(GLES2ResourceManager *this,int index)

{
  int in_EDX;
  SharedPtrStateBase *extraout_RDX;
  undefined4 in_register_00000034;
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
  *this_00;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> SVar1;
  
  this_00 = (vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
             *)CONCAT44(in_register_00000034,index);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)this,
             (this_00->
             super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
             )._M_impl.super__Vector_impl_data._M_start + in_EDX);
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
  ::erase(this_00,(this_00->
                  super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + in_EDX);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = (Texture *)this;
  return SVar1;
}

Assistant:

SharedPtr<Texture> GLES2ResourceManager::popTexture (int index)
{
	SharedPtr<Texture> texture = m_textures[index];

	m_textures.erase(m_textures.begin() + index);

	return texture;
}